

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglChooseConfigReference.cpp
# Opt level: O0

bool deqp::egl::operator==(SurfaceConfig *a,SurfaceConfig *b)

{
  EGLenum attribute_00;
  bool bVar1;
  EGLint EVar2;
  EGLint EVar3;
  pointer ppVar4;
  const_iterator cStack_60;
  EGLenum attribute;
  _Self local_58;
  const_iterator iter;
  map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
  defaultRules;
  SurfaceConfig *b_local;
  SurfaceConfig *a_local;
  
  SurfaceConfig::getDefaultRules();
  local_58._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
       ::begin((map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
                *)&iter);
  do {
    cStack_60 = std::
                map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
                ::end((map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
                       *)&iter);
    bVar1 = std::operator!=(&local_58,&stack0xffffffffffffffa0);
    if (!bVar1) {
      a_local._7_1_ = true;
LAB_0183c468:
      std::
      map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
      ::~map((map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
              *)&iter);
      return a_local._7_1_;
    }
    ppVar4 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>::
             operator->(&local_58);
    attribute_00 = ppVar4->first;
    EVar2 = SurfaceConfig::getAttribute(a,attribute_00);
    EVar3 = SurfaceConfig::getAttribute(b,attribute_00);
    if (EVar2 != EVar3) {
      a_local._7_1_ = false;
      goto LAB_0183c468;
    }
    std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>::operator++
              (&local_58,0);
  } while( true );
}

Assistant:

bool operator== (const SurfaceConfig& a, const SurfaceConfig& b)
	{
		const std::map<EGLenum, AttribRule> defaultRules = getDefaultRules();

		for (std::map<EGLenum, AttribRule>::const_iterator iter = defaultRules.begin(); iter != defaultRules.end(); iter++)
		{
			const EGLenum attribute = iter->first;

			if (a.getAttribute(attribute) != b.getAttribute(attribute)) return false;
		}
		return true;
	}